

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

bool ghc::filesystem::copy_file(path *from,path *to,copy_options options,error_code *ec)

{
  bool bVar1;
  int __fd;
  int iVar2;
  error_category *peVar3;
  file_time_type fVar4;
  file_time_type fVar5;
  size_t __n;
  ssize_t sVar6;
  long lVar7;
  error_code eVar8;
  __allocator_type __a2_1;
  file_status st;
  shared_ptr<void> guard_in;
  error_code tect;
  file_status sf;
  vector<char,_std::allocator<char>_> buffer;
  shared_ptr<void> guard_out;
  __allocated_ptr<std::allocator<std::_Sp_counted_deleter<std::nullptr_t,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Kingcom[P]armips_ext_filesystem_include_ghc_filesystem_hpp:3510:45),_std::allocator<void>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_50;
  error_code tecf;
  
  tecf._M_value = 0;
  peVar3 = (error_category *)std::_V2::system_category();
  tect._M_value = 0;
  tect._M_cat = peVar3;
  tecf._M_cat = peVar3;
  status((filesystem *)&sf,from,&tecf);
  status((filesystem *)&st,to,&tect);
  std::error_code::clear(ec);
  if (sf._type == regular) {
    iVar2 = 0x2c1;
    if (not_found < st._type) {
      if (((st._type != regular) ||
          (bVar1 = equivalent(from,to,ec),
          (options & (update_existing|overwrite_existing|skip_existing)) == none)) || (bVar1)) {
        if (tect._M_value == 0) {
          tect._M_value = 0x11;
          tect._M_cat = peVar3;
        }
        ec->_M_value = tect._M_value;
        *(undefined4 *)&ec->field_0x4 = tect._4_4_;
        ec->_M_cat = tect._M_cat;
        goto LAB_0014c57e;
      }
      if ((not_found < st._type) && (iVar2 = 0x241, (options & update_existing) != none)) {
        fVar4 = last_write_time(from,ec);
        if ((ec->_M_value != 0) || (fVar5 = last_write_time(to,ec), ec->_M_value != 0)) {
          eVar8 = detail::make_system_error(0);
          ec->_M_value = eVar8._M_value;
          ec->_M_cat = eVar8._M_cat;
          return false;
        }
        if ((long)fVar4.__d.__r <= (long)fVar5.__d.__r) goto LAB_0014c57e;
      }
    }
    local_50._M_alloc =
         (allocator<std::_Sp_counted_deleter<std::nullptr_t,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Kingcom[P]armips_ext_filesystem_include_ghc_filesystem_hpp:3510:45),_std::allocator<void>,_(__gnu_cxx::_Lock_policy)2>_>
          *)((ulong)local_50._M_alloc & 0xffffffffffffff00);
    std::vector<char,_std::allocator<char>_>::vector
              (&buffer,0x4000,(value_type *)&local_50,(allocator_type *)&guard_in);
    __fd = open((from->_path)._M_dataplus._M_p,0);
    if (__fd < 0) {
      bVar1 = false;
      eVar8 = detail::make_system_error(0);
      ec->_M_value = eVar8._M_value;
      ec->_M_cat = eVar8._M_cat;
    }
    else {
      guard_in.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      guard_in.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      guard_in.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
      local_50._M_alloc =
           (allocator<std::_Sp_counted_deleter<std::nullptr_t,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Kingcom[P]armips_ext_filesystem_include_ghc_filesystem_hpp:3510:45),_std::allocator<void>,_(__gnu_cxx::_Lock_policy)2>_>
            *)&guard_out;
      (guard_in.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = 1;
      (guard_in.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_weak_count = 1;
      (guard_in.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_base_001b4d88;
      *(int *)&guard_in.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
               _vptr__Sp_counted_base = __fd;
      guard_in.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
      _M_use_count = 0;
      guard_in.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
      _M_weak_count = 0;
      local_50._M_ptr = (pointer)0x0;
      std::
      __allocated_ptr<std::allocator<std::_Sp_counted_deleter<std::nullptr_t,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/ext/filesystem/include/ghc/filesystem.hpp:3510:45),_std::allocator<void>,_(__gnu_cxx::_Lock_policy)2>_>_>
      ::~__allocated_ptr(&local_50);
      iVar2 = open((to->_path)._M_dataplus._M_p,iVar2,(ulong)(sf._perms & 0x1ff));
      if (iVar2 < 0) {
        bVar1 = false;
        eVar8 = detail::make_system_error(0);
        ec->_M_value = eVar8._M_value;
        ec->_M_cat = eVar8._M_cat;
      }
      else {
        guard_out.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
        guard_out.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        guard_out.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
        local_50._M_alloc =
             (allocator<std::_Sp_counted_deleter<std::nullptr_t,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Kingcom[P]armips_ext_filesystem_include_ghc_filesystem_hpp:3510:45),_std::allocator<void>,_(__gnu_cxx::_Lock_policy)2>_>
              *)&__a2_1;
        (guard_out.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = 1;
        (guard_out.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_weak_count = 1;
        (guard_out.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_base_001b4de8;
        *(int *)&guard_out.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1]
                 ._vptr__Sp_counted_base = iVar2;
        guard_out.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
        _M_use_count = 0;
        guard_out.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
        _M_weak_count = 0;
        local_50._M_ptr = (pointer)0x0;
        std::
        __allocated_ptr<std::allocator<std::_Sp_counted_deleter<std::nullptr_t,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/ext/filesystem/include/ghc/filesystem.hpp:3519:46),_std::allocator<void>,_(__gnu_cxx::_Lock_policy)2>_>_>
        ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_deleter<std::nullptr_t,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Kingcom[P]armips_ext_filesystem_include_ghc_filesystem_hpp:3519:46),_std::allocator<void>,_(__gnu_cxx::_Lock_policy)2>_>_>
                            *)&local_50);
        while( true ) {
          __n = read(__fd,buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                     (long)buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start);
          bVar1 = (long)__n < 1;
          if ((long)__n < 1) break;
          lVar7 = 0;
          do {
            sVar6 = write(iVar2,buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start + lVar7,__n);
            if (sVar6 < 1) {
              if (sVar6 < 0) {
                eVar8 = detail::make_system_error(0);
                ec->_M_value = eVar8._M_value;
                ec->_M_cat = eVar8._M_cat;
                goto LAB_0014c562;
              }
            }
            else {
              __n = __n - sVar6;
              lVar7 = lVar7 + sVar6;
            }
          } while (__n != 0);
        }
LAB_0014c562:
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&guard_out.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&guard_in.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&buffer.super__Vector_base<char,_std::allocator<char>_>);
  }
  else {
    *(ulong *)ec = CONCAT44(tecf._4_4_,tecf._M_value);
    ec->_M_cat = tecf._M_cat;
LAB_0014c57e:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

GHC_INLINE bool copy_file(const path& from, const path& to, copy_options options, std::error_code& ec) noexcept
{
    std::error_code tecf, tect;
    auto sf = status(from, tecf);
    auto st = status(to, tect);
    bool overwrite = false;
    ec.clear();
    if (!is_regular_file(sf)) {
        ec = tecf;
        return false;
    }
    if (exists(st) && (!is_regular_file(st) || equivalent(from, to, ec) || (options & (copy_options::skip_existing | copy_options::overwrite_existing | copy_options::update_existing)) == copy_options::none)) {
        ec = tect ? tect : detail::make_error_code(detail::portable_error::exists);
        return false;
    }
    if (exists(st)) {
        if ((options & copy_options::update_existing) == copy_options::update_existing) {
            auto from_time = last_write_time(from, ec);
            if (ec) {
                ec = detail::make_system_error();
                return false;
            }
            auto to_time = last_write_time(to, ec);
            if (ec) {
                ec = detail::make_system_error();
                return false;
            }
            if (from_time <= to_time) {
                return false;
            }
        }
        overwrite = true;
    }
#ifdef GHC_OS_WINDOWS
    if (!::CopyFileW(detail::fromUtf8<std::wstring>(from.u8string()).c_str(), detail::fromUtf8<std::wstring>(to.u8string()).c_str(), !overwrite)) {
        ec = detail::make_system_error();
        return false;
    }
    return true;
#else
    std::vector<char> buffer(16384, '\0');
    int in = -1, out = -1;
    if ((in = ::open(from.c_str(), O_RDONLY)) < 0) {
        ec = detail::make_system_error();
        return false;
    }
    std::shared_ptr<void> guard_in(nullptr, [in](void*) { ::close(in); });
    int mode = O_CREAT | O_WRONLY | O_TRUNC;
    if (!overwrite) {
        mode |= O_EXCL;
    }
    if ((out = ::open(to.c_str(), mode, static_cast<int>(sf.permissions() & perms::all))) < 0) {
        ec = detail::make_system_error();
        return false;
    }
    std::shared_ptr<void> guard_out(nullptr, [out](void*) { ::close(out); });
    ssize_t br, bw;
    while ((br = ::read(in, buffer.data(), buffer.size())) > 0) {
        ssize_t offset = 0;
        do {
            if ((bw = ::write(out, buffer.data() + offset, static_cast<size_t>(br))) > 0) {
                br -= bw;
                offset += bw;
            }
            else if (bw < 0) {
                ec = detail::make_system_error();
                return false;
            }
        } while (br);
    }
    return true;
#endif
}